

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::PopAndCheck1Type(TypeChecker *this,Type expected,char *desc)

{
  Result RVar1;
  char *desc_local;
  TypeChecker *this_local;
  Type expected_local;
  Result result;
  
  this_local._0_4_ = expected.enum_;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  RVar1 = PeekAndCheckType(this,0,this_local._0_4_);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  PrintStackIfFailed<wabt::Type>(this,this_local._4_4_,desc,this_local._0_4_);
  RVar1 = DropTypes(this,1);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::PopAndCheck1Type(Type expected, const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected);
  PrintStackIfFailed(result, desc, expected);
  result |= DropTypes(1);
  return result;
}